

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.c
# Opt level: O3

void luaD_shrinkstack(lua_State *L)

{
  StkId *ppTVar1;
  GCObject *pGVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  StkId pTVar6;
  CallInfo *pCVar7;
  StkId pTVar8;
  int iVar9;
  int *piVar10;
  long lVar11;
  int iVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  int iVar17;
  undefined1 auVar16 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  
  pCVar7 = L->ci;
  pTVar8 = L->top;
  while (pCVar7 != (CallInfo *)0x0) {
    ppTVar1 = &pCVar7->top;
    pCVar7 = pCVar7->previous;
    if (pTVar8 < *ppTVar1) {
      pTVar8 = *ppTVar1;
    }
  }
  iVar17 = (int)((ulong)((long)pTVar8 - (long)L->stack) >> 4);
  iVar12 = iVar17 + 8;
  if (-1 < iVar17 + 1) {
    iVar12 = iVar17 + 1;
  }
  iVar9 = (iVar12 >> 3) + iVar17 + 1;
  iVar12 = 0xf4236;
  if (iVar9 < 0xf4236) {
    iVar12 = iVar9;
  }
  if ((iVar17 < 1000000) && (iVar12 = iVar12 + 10, iVar12 < L->stacksize)) {
    if (-2 < iVar12) {
      pTVar8 = L->stack;
      iVar17 = L->stacksize;
      lVar11 = (long)iVar17;
      lVar14 = (long)iVar12;
      pTVar6 = (StkId)luaM_realloc_(L,pTVar8,lVar11 * 0x10,lVar14 * 0x10);
      L->stack = pTVar6;
      auVar5 = _DAT_0011d020;
      auVar4 = _DAT_0011d010;
      auVar3 = _DAT_0011d000;
      if (iVar17 < iVar12) {
        lVar15 = (lVar14 - lVar11) + -1;
        auVar16._8_4_ = (int)lVar15;
        auVar16._0_8_ = lVar15;
        auVar16._12_4_ = (int)((ulong)lVar15 >> 0x20);
        piVar10 = &pTVar6[lVar11 + 3].tt_;
        uVar13 = 0;
        auVar16 = auVar16 ^ _DAT_0011d020;
        do {
          auVar18._8_4_ = (int)uVar13;
          auVar18._0_8_ = uVar13;
          auVar18._12_4_ = (int)(uVar13 >> 0x20);
          auVar19 = (auVar18 | auVar4) ^ auVar5;
          iVar17 = auVar16._4_4_;
          if ((bool)(~(auVar19._4_4_ == iVar17 && auVar16._0_4_ < auVar19._0_4_ ||
                      iVar17 < auVar19._4_4_) & 1)) {
            piVar10[-0xc] = 0;
          }
          if ((auVar19._12_4_ != auVar16._12_4_ || auVar19._8_4_ <= auVar16._8_4_) &&
              auVar19._12_4_ <= auVar16._12_4_) {
            piVar10[-8] = 0;
          }
          auVar18 = (auVar18 | auVar3) ^ auVar5;
          iVar9 = auVar18._4_4_;
          if (iVar9 <= iVar17 && (iVar9 != iVar17 || auVar18._0_4_ <= auVar16._0_4_)) {
            piVar10[-4] = 0;
            *piVar10 = 0;
          }
          uVar13 = uVar13 + 4;
          piVar10 = piVar10 + 0x10;
        } while (((lVar14 - lVar11) + 3U & 0xfffffffffffffffc) != uVar13);
      }
      L->stacksize = iVar12;
      L->stack_last = pTVar6 + lVar14 + -5;
      L->top = (StkId)(((long)L->top - (long)pTVar8) + (long)pTVar6);
      pGVar2 = L->openupval;
      while (pGVar2 != (GCObject *)0x0) {
        (pGVar2->h).array = (TValue *)(((long)(pGVar2->h).array - (long)pTVar8) + (long)L->stack);
        pGVar2 = (pGVar2->gch).next;
      }
      for (pCVar7 = L->ci; pCVar7 != (CallInfo *)0x0; pCVar7 = pCVar7->previous) {
        pTVar6 = L->stack;
        pCVar7->top = (StkId)(((long)pCVar7->top - (long)pTVar8) + (long)pTVar6);
        pCVar7->func = (StkId)(((long)pCVar7->func - (long)pTVar8) + (long)pTVar6);
        if ((pCVar7->callstatus & 1) != 0) {
          (pCVar7->u).l.base = (StkId)((long)pTVar6 + ((long)(pCVar7->u).l.base - (long)pTVar8));
        }
      }
      return;
    }
    luaM_toobig(L);
  }
  return;
}

Assistant:

static int stackinuse (lua_State *L) {
  CallInfo *ci;
  StkId lim = L->top;
  for (ci = L->ci; ci != NULL; ci = ci->previous) {
    lua_assert(ci->top <= L->stack_last);
    if (lim < ci->top) lim = ci->top;
  }
  return cast_int(lim - L->stack) + 1;  /* part of stack in use */
}